

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall
ON_UuidPtrList::AddUuidPtr
          (ON_UuidPtrList *this,ON_UUID uuid,ON__UINT_PTR ptr,bool bCheckForDupicates)

{
  bool bVar1;
  ON_UuidPtr *pOVar2;
  byte local_51;
  ON_UuidPtr *ui;
  bool local_2a;
  bool rc;
  bool bCheckForDupicates_local;
  ON__UINT_PTR ptr_local;
  ON_UuidPtrList *this_local;
  ON_UUID uuid_local;
  
  uuid_local._0_8_ = uuid.Data4;
  this_local = uuid._0_8_;
  if (bCheckForDupicates) {
    bVar1 = FindUuid(this,uuid,(ON__UINT_PTR *)0x0);
    local_51 = bVar1 ^ 0xff;
  }
  else {
    local_51 = 1;
  }
  local_2a = (bool)(local_51 & 1);
  if (local_2a != false) {
    bVar1 = ::operator==(&ON_max_uuid,(ON_UUID_struct *)&this_local);
    if (bVar1) {
      local_2a = false;
    }
    else {
      pOVar2 = ON_SimpleArray<ON_UuidPtr>::AppendNew(&this->super_ON_SimpleArray<ON_UuidPtr>);
      *(ON_UuidPtrList **)&pOVar2->m_id = this_local;
      *(undefined8 *)(pOVar2->m_id).Data4 = uuid_local._0_8_;
      pOVar2->m_ptr = ptr;
    }
  }
  return local_2a;
}

Assistant:

bool ON_UuidPtrList::AddUuidPtr(ON_UUID uuid, ON__UINT_PTR ptr, bool bCheckForDupicates)
{
  bool rc = bCheckForDupicates ? !FindUuid(uuid,nullptr) : true;
  if (rc)
  {
    if ( ON_max_uuid == uuid )
      rc = 0;
    else
    {
      ON_UuidPtr& ui = AppendNew();
      ui.m_id = uuid;
      ui.m_ptr = ptr;
    }
  }
  return rc;
}